

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O0

void easm_del_mods(easm_mods *mods)

{
  int local_14;
  int i;
  easm_mods *mods_local;
  
  if (mods != (easm_mods *)0x0) {
    for (local_14 = 0; local_14 < mods->modsnum; local_14 = local_14 + 1) {
      easm_del_mod(mods->mods[local_14]);
    }
    free(mods->mods);
    free(mods);
  }
  return;
}

Assistant:

void easm_del_mods(struct easm_mods *mods) {
	if (!mods) return;
	int i;
	for (i = 0; i < mods->modsnum; i++)
		easm_del_mod(mods->mods[i]);
	free(mods->mods);
	free(mods);
}